

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall
S2Builder::SortSitesByDistance
          (S2Builder *this,S2Point *x,compact_array<int,_std::allocator<int>_> *sites)

{
  anon_class_16_2_d7082b5d __comp;
  iterator __first;
  iterator __last;
  compact_array<int,_std::allocator<int>_> *sites_local;
  S2Point *x_local;
  S2Builder *this_local;
  
  __first = gtl::compact_array_base<int,_std::allocator<int>_>::begin
                      (&sites->super_compact_array_base<int,_std::allocator<int>_>);
  __last = gtl::compact_array_base<int,_std::allocator<int>_>::end
                     (&sites->super_compact_array_base<int,_std::allocator<int>_>);
  __comp.this = this;
  __comp.x = x;
  std::
  sort<int*,S2Builder::SortSitesByDistance(Vector3<double>const&,gtl::compact_array<int,std::allocator<int>>*)const::__0>
            (__first,__last,__comp);
  return;
}

Assistant:

void S2Builder::SortSitesByDistance(const S2Point& x,
                                    compact_array<SiteId>* sites) const {
  // Sort sites in increasing order of distance to X.
  std::sort(sites->begin(), sites->end(),
            [&x, this](SiteId i, SiteId j) {
      return s2pred::CompareDistances(x, sites_[i], sites_[j]) < 0;
    });
}